

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hrgls_Message_impl.hpp
# Opt level: O1

string * __thiscall hrgls::Message::Value_abi_cxx11_(string *__return_storage_ptr__,Message *this)

{
  Message_private *pMVar1;
  char *__s;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  pMVar1 = this->m_private;
  if (pMVar1->Message == (hrgls_Message)0x0) {
    pMVar1->status = 0x3ee;
  }
  else {
    __s = (pMVar1->Message->value)._M_dataplus._M_p;
    pMVar1->status = 0;
    strlen(__s);
    std::__cxx11::string::_M_replace((ulong)__return_storage_ptr__,0,(char *)0x0,(ulong)__s);
  }
  return __return_storage_ptr__;
}

Assistant:

::std::string Message::Value() const
  {
    ::std::string ret;
    if (!m_private->Message) {
      m_private->status = hrgls_STATUS_NULL_OBJECT_POINTER;
      return ret;
    }
    const char *val = "";
    m_private->status = hrgls_MessageGetValue(m_private->Message, &val);
    ret = val;
    return ret;
  }